

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O2

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::load(XMLLoader *this,FileName *fileName,AffineSpace3fa *space)

{
  SharedState state;
  XMLLoader loader;
  SharedState local_190;
  XMLLoader local_d0;
  
  local_190.materialMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_190.materialMap._M_t._M_impl.super__Rb_tree_header._M_header;
  local_190.materialMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_190.materialMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_190.materialMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_190.materialCache._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_190.materialCache._M_t._M_impl.super__Rb_tree_header._M_header;
  local_190.materialCache._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_190.materialCache._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_190.materialCache._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_190.sceneMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_190.sceneMap._M_t._M_impl.super__Rb_tree_header._M_header;
  local_190.sceneMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_190.sceneMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_190.sceneMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_190.textureMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_190.textureMap._M_t._M_impl.super__Rb_tree_header._M_header;
  local_190.textureMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_190.textureMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_190.textureMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_190.materialMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_190.materialMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_190.materialCache._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_190.materialCache._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_190.sceneMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_190.sceneMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_190.textureMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_190.textureMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  XMLLoader(&local_d0,fileName,space,&local_190);
  (this->path).filename._M_dataplus._M_p = (pointer)local_d0.root.ptr;
  if (local_d0.root.ptr != (Node *)0x0) {
    (*((local_d0.root.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  ~XMLLoader(&local_d0);
  SharedState::~SharedState(&local_190);
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::load(const FileName& fileName, const AffineSpace3fa& space)
  {
    SharedState state;
    XMLLoader loader(fileName,space,state); return loader.root;
  }